

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexMathFloatExc.cpp
# Opt level: O0

void __thiscall Iex_3_2::MathExcOn::MathExcOn(MathExcOn *this,int when)

{
  int iVar1;
  int in_ESI;
  undefined1 *in_RDI;
  
  *in_RDI = 0;
  iVar1 = getMathExcOn();
  *(int *)(in_RDI + 4) = iVar1;
  if (*(int *)(in_RDI + 4) != in_ESI) {
    *in_RDI = 1;
    mathExcOn(0);
  }
  return;
}

Assistant:

MathExcOn::MathExcOn (int when) : _changed (false)
{
    _saved = getMathExcOn ();

    if (_saved != when)
    {
        _changed = true;
        mathExcOn (when);
    }
}